

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tinf.c
# Opt level: O2

void GREATEST_INIT(void)

{
  memset(&greatest_info,0,0x1b8);
  greatest_info.width = 0x48;
  greatest_info.begin = clock();
  if (greatest_info.begin != -1) {
    return;
  }
  fprintf(_stdout,"clock error: %s\n","greatest_info.begin");
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
	GREATEST_MAIN_BEGIN();

	srand(time(NULL));

	tinf_init();

	RUN_SUITE(tinflate);
	RUN_SUITE(tinfzlib);
	RUN_SUITE(tinfgzip);

	GREATEST_MAIN_END();
}